

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> * __thiscall
SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter>::operator>>=
          (SafeInt<signed_char,safeint_exception_handlers::SafeInt_InvalidParameter> *this,
          SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> bits)

{
  if (bits.m_int < '\0') {
    __assert_fail("!std::numeric_limits< U >::is_signed || (U)bits >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                  ,0x17b3,
                  "SafeInt<T, E> &SafeInt<signed char>::operator>>=(SafeInt<U, E>) [T = signed char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = signed char]"
                 );
  }
  if (bits.m_int < '\b') {
    *this = SUB41((int)(char)*this >> (bits.m_int & 0x1fU),0);
    return (SafeInt<signed_char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)this;
  }
  __assert_fail("(U)bits < (int)safeint_internal::int_traits< T >::bitCount",
                "/workspace/llm4binary/github/license_c_cmakelists/dcleblanc[P]SafeInt/Test/../SafeInt.hpp"
                ,0x17b4,
                "SafeInt<T, E> &SafeInt<signed char>::operator>>=(SafeInt<U, E>) [T = signed char, E = safeint_exception_handlers::SafeInt_InvalidParameter, U = signed char]"
               );
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E >& operator >>=( SafeInt< U, E > bits ) SAFEINT_NOTHROW
    {
        ShiftAssert( !std::numeric_limits< U >::is_signed || (U)bits >= 0 );
        ShiftAssert( (U)bits < (int)safeint_internal::int_traits< T >::bitCount );

        m_int >>= (U)bits;
        return *this;
    }